

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddPriority.c
# Opt level: O2

DdNode * Cudd_bddInterval(DdManager *dd,int N,DdNode **x,uint lowerB,uint upperB)

{
  int *piVar1;
  DdNode *pDVar2;
  DdNode *pDVar3;
  DdNode *pDVar4;
  DdNode *pDVar5;
  DdNode *g;
  ulong uVar6;
  bool bVar7;
  uint local_58;
  uint local_54;
  
  pDVar4 = dd->one;
  piVar1 = (int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4);
  *piVar1 = *piVar1 + 2;
  g = pDVar4;
  pDVar5 = pDVar4;
  local_58 = upperB;
  local_54 = lowerB;
  for (uVar6 = (ulong)(uint)N; 0 < (int)uVar6; uVar6 = uVar6 - 1) {
    bVar7 = (local_54 & 1) == 0;
    pDVar2 = pDVar5;
    if (bVar7) {
      pDVar2 = pDVar4;
    }
    pDVar3 = (DdNode *)((ulong)pDVar4 ^ 1);
    if (bVar7) {
      pDVar3 = pDVar5;
    }
    pDVar2 = Cudd_bddIte(dd,x[uVar6 - 1],pDVar2,pDVar3);
    if (pDVar2 == (DdNode *)0x0) goto LAB_0065f722;
    piVar1 = (int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    Cudd_IterDerefBdd(dd,pDVar5);
    bVar7 = (local_58 & 1) == 0;
    pDVar5 = g;
    if (bVar7) {
      pDVar5 = (DdNode *)((ulong)pDVar4 ^ 1);
    }
    pDVar3 = pDVar4;
    if (bVar7) {
      pDVar3 = g;
    }
    pDVar3 = Cudd_bddIte(dd,x[uVar6 - 1],pDVar5,pDVar3);
    pDVar5 = pDVar2;
    if (pDVar3 == (DdNode *)0x0) goto LAB_0065f722;
    local_54 = local_54 >> 1;
    piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    Cudd_IterDerefBdd(dd,g);
    local_58 = local_58 >> 1;
    g = pDVar3;
  }
  pDVar4 = Cudd_bddAnd(dd,pDVar5,g);
  if (pDVar4 == (DdNode *)0x0) {
LAB_0065f722:
    Cudd_IterDerefBdd(dd,pDVar5);
    Cudd_IterDerefBdd(dd,g);
    pDVar4 = (DdNode *)0x0;
  }
  else {
    piVar1 = (int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    Cudd_IterDerefBdd(dd,pDVar5);
    Cudd_IterDerefBdd(dd,g);
    piVar1 = (int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + -1;
  }
  return pDVar4;
}

Assistant:

DdNode *
Cudd_bddInterval(
  DdManager * dd /* DD manager */,
  int  N /* number of x variables */,
  DdNode ** x /* array of x variables */,
  unsigned int lowerB /* lower bound */,
  unsigned int upperB /* upper bound */)
{
    DdNode *one, *zero;
    DdNode *r, *rl, *ru;
    int     i;

    one = DD_ONE(dd);
    zero = Cudd_Not(one);

    rl = one;
    cuddRef(rl);
    ru = one;
    cuddRef(ru);

    /* Loop to build the rest of the BDDs. */
    for (i = N-1; i >= 0; i--) {
        DdNode *vl, *vu;
        vl = Cudd_bddIte(dd, x[i],
                         lowerB&1 ? rl : one,
                         lowerB&1 ? zero : rl);
        if (vl == NULL) {
            Cudd_IterDerefBdd(dd, rl);
            Cudd_IterDerefBdd(dd, ru);
            return(NULL);
        }
        cuddRef(vl);
        Cudd_IterDerefBdd(dd, rl);
        rl = vl;
        lowerB >>= 1;
        vu = Cudd_bddIte(dd, x[i],
                         upperB&1 ? ru : zero,
                         upperB&1 ? one : ru);
        if (vu == NULL) {
            Cudd_IterDerefBdd(dd, rl);
            Cudd_IterDerefBdd(dd, ru);
            return(NULL);
        }
        cuddRef(vu);
        Cudd_IterDerefBdd(dd, ru);
        ru = vu;
        upperB >>= 1;
    }

    /* Conjoin the two bounds. */
    r = Cudd_bddAnd(dd, rl, ru);
    if (r == NULL) {
        Cudd_IterDerefBdd(dd, rl);
        Cudd_IterDerefBdd(dd, ru);
        return(NULL);
    }
    cuddRef(r);
    Cudd_IterDerefBdd(dd, rl);
    Cudd_IterDerefBdd(dd, ru);
    cuddDeref(r);
    return(r);

}